

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_encoder.hpp
# Opt level: O2

bool __thiscall
jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::visit_key
          (basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *this,
          string_view_type *name,ser_context *context,error_code *ec)

{
  visit_string(this,name,none,context,ec);
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_key(const string_view_type& name, const ser_context& context, std::error_code& ec) override
    {
        visit_string(name, semantic_tag::none, context, ec);
        JSONCONS_VISITOR_RETURN;
    }